

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O1

bool __thiscall kws::Generator::GenerateHTML(Generator *this,char *dir,bool showAllErrors)

{
  char *pcVar1;
  pointer pcVar2;
  iterator __position;
  size_type sVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  char cVar6;
  uint uVar7;
  Status SVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ostream *poVar13;
  ulong uVar14;
  undefined7 in_register_00000011;
  pointer ppVar15;
  char cVar16;
  pointer *pplVar17;
  unsigned_long i;
  uint uVar18;
  pointer pEVar19;
  unsigned_long *puVar20;
  bool bVar21;
  CopyStatus CVar22;
  ErrorLineType errLine;
  string filename2;
  string filename;
  string l;
  Directory directory;
  vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
  errorLines;
  string imagedir;
  ErrorVectorType errors;
  string imageProjectLogo;
  undefined1 auStack_358 [7];
  bool local_351;
  Generator *local_350;
  pointer local_348;
  uint local_33c;
  value_type local_338;
  string local_310;
  string local_2f0;
  string local_2d0;
  char *local_2b0;
  Directory local_2a8;
  uint local_29c;
  vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
  local_298;
  undefined8 local_280;
  char *local_278;
  char *local_270;
  long local_268;
  char local_260 [16];
  unsigned_long local_250;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> local_248;
  undefined1 local_230 [16];
  char local_220 [232];
  ios_base local_138 [264];
  
  uVar14 = CONCAT71(in_register_00000011,showAllErrors) & 0xffffffff;
  local_350 = this;
  kwssys::Directory::Directory(&local_2a8);
  std::__cxx11::string::string((string *)local_230,dir,(allocator *)&local_270);
  SVar8 = kwssys::Directory::Load(&local_2a8,(string *)local_230,(string *)0x0);
  if ((char *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_);
  }
  if (SVar8.Kind_ != Success) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Creating HTML directory: ",0x19);
    if (dir == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
    }
    else {
      sVar9 = strlen(dir);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    SVar8 = kwssys::SystemTools::MakeDirectory(dir,(mode_t *)0x0);
    if (SVar8.Kind_ != Success) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot create HTML directory: ",0x1e);
      if (dir == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar9 = strlen(dir);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
  }
  std::__cxx11::string::string((string *)&local_270,dir,(allocator *)local_230);
  std::__cxx11::string::append((char *)&local_270);
  if (((local_350->m_KWStyleLogo)._M_string_length != 0 ||
       (local_350->m_ProjectLogo)._M_string_length != 0) &&
     (SVar8 = kwssys::SystemTools::MakeDirectory(local_270,(mode_t *)0x0), SVar8.Kind_ != Success))
  {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot create images directory: ",0x20);
    pcVar1 = local_270;
    if (local_270 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
    }
    else {
      sVar9 = strlen(local_270);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  local_2b0 = dir;
  if ((local_350->m_ProjectLogo)._M_string_length != 0) {
    local_230._0_8_ = local_220;
    std::__cxx11::string::_M_construct<char*>((string *)local_230,local_270,local_270 + local_268);
    std::__cxx11::string::append(local_230);
    std::__cxx11::string::string
              ((string *)&local_310,(local_350->m_ProjectLogo)._M_dataplus._M_p,
               (allocator *)&local_338);
    kwssys::SystemTools::GetFilenameName(&local_2f0,&local_310);
    std::__cxx11::string::_M_append(local_230,(ulong)local_2f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    std::__cxx11::string::string
              ((string *)&local_2f0,(local_350->m_ProjectLogo)._M_dataplus._M_p,
               (allocator *)&local_338);
    std::__cxx11::string::string
              ((string *)&local_310,(char *)local_230._0_8_,(allocator *)&local_2d0);
    CVar22 = kwssys::SystemTools::CopyFileIfDifferent(&local_2f0,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    dir = local_2b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if (CVar22.super_Status.Kind_ != Success) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot copy the project logo file: ",0x23);
      pcVar1 = (local_350->m_ProjectLogo)._M_dataplus._M_p;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar9 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," into ",6);
      uVar5 = local_230._0_8_;
      if ((char *)local_230._0_8_ == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar9 = strlen((char *)local_230._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)uVar5,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    if ((char *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  if ((local_350->m_KWStyleLogo)._M_string_length != 0) {
    local_230._0_8_ = local_220;
    std::__cxx11::string::_M_construct<char*>((string *)local_230,local_270,local_270 + local_268);
    std::__cxx11::string::append(local_230);
    std::__cxx11::string::string
              ((string *)&local_310,(local_350->m_KWStyleLogo)._M_dataplus._M_p,
               (allocator *)&local_338);
    kwssys::SystemTools::GetFilenameName(&local_2f0,&local_310);
    std::__cxx11::string::_M_append(local_230,(ulong)local_2f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    std::__cxx11::string::string
              ((string *)&local_2f0,(local_350->m_KWStyleLogo)._M_dataplus._M_p,
               (allocator *)&local_338);
    std::__cxx11::string::string
              ((string *)&local_310,(char *)local_230._0_8_,(allocator *)&local_2d0);
    CVar22 = kwssys::SystemTools::CopyFileIfDifferent(&local_2f0,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    dir = local_2b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if (CVar22.super_Status.Kind_ != Success) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot copy the KWStyle logo file: ",0x23);
      pcVar1 = (local_350->m_KWStyleLogo)._M_dataplus._M_p;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar9 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," into ",6);
      uVar5 = local_230._0_8_;
      if ((char *)local_230._0_8_ == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
      }
      else {
        sVar9 = strlen((char *)local_230._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)uVar5,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    if ((char *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  GenerateMatrix(local_350,dir,SUB81(uVar14,0));
  GenerateDescription(local_350,dir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating HTML...",0x12);
  local_348 = (local_350->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_351 = local_348 ==
              (local_350->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  if (!local_351) {
    local_278 = _VTT;
    local_280 = _getpwnam;
    local_29c = (uint)CONCAT71(in_register_00000011,showAllErrors);
    do {
      if (((char)uVar14 == '\0') &&
         ((local_348->m_ErrorList).
          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (local_348->m_ErrorList).
          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        local_348 = local_348 + 1;
      }
      else {
        std::ofstream::ofstream(local_230);
        pcVar2 = (local_348->m_Filename)._M_dataplus._M_p;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,pcVar2,pcVar2 + (local_348->m_Filename)._M_string_length);
        sVar3 = local_2f0._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p);
        }
        if (sVar3 == 0) {
          local_348 = local_348 + 1;
          bVar21 = false;
        }
        else {
          std::__cxx11::string::string((string *)&local_2f0,dir,(allocator *)&local_310);
          std::__cxx11::string::append((char *)&local_2f0);
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          pcVar2 = (local_348->m_Filename)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,pcVar2,pcVar2 + (local_348->m_Filename)._M_string_length);
          lVar10 = std::__cxx11::string::find((char *)&local_310,0x179702,0);
          if (lVar10 != -1) {
            std::__cxx11::string::substr((ulong)&local_338,(ulong)&local_310);
            std::__cxx11::string::operator=((string *)&local_310,(string *)&local_338);
            if ((pointer *)local_338.first !=
                &local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_338.first);
            }
          }
          lVar10 = std::__cxx11::string::find((char *)&local_310,0x177464,0);
          if (lVar10 != -1) {
            std::__cxx11::string::substr((ulong)&local_338,(ulong)&local_310);
            std::__cxx11::string::operator=((string *)&local_310,(string *)&local_338);
            if ((pointer *)local_338.first !=
                &local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_338.first);
            }
          }
          uVar11 = std::__cxx11::string::find_last_of
                             ((char *)&local_310,0x16b541,0xffffffffffffffff);
          if ((uVar11 != 0xffffffffffffffff) && (local_350->m_MaxDirectoryDepth != 0)) {
            uVar18 = 1;
            do {
              std::__cxx11::string::replace((ulong)&local_310,uVar11,(char *)0x1,0x178e68);
              uVar11 = std::__cxx11::string::find_last_of
                                 ((char *)&local_310,0x16b541,0xffffffffffffffff);
              if (uVar11 == 0xffffffffffffffff) break;
              bVar21 = uVar18 < local_350->m_MaxDirectoryDepth;
              uVar18 = uVar18 + 1;
            } while (bVar21);
          }
          lVar10 = std::__cxx11::string::find_last_of
                             ((char *)&local_310,0x16b541,0xffffffffffffffff);
          if (lVar10 != -1) {
            std::__cxx11::string::substr((ulong)&local_338,(ulong)&local_310);
            std::__cxx11::string::operator=((string *)&local_310,(string *)&local_338);
            if ((pointer *)local_338.first !=
                &local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_338.first);
            }
          }
          std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_310._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_2f0);
          std::ofstream::open(local_230,(_Ios_Openmode)local_2f0._M_dataplus._M_p);
          cVar6 = std::__basic_file<char>::is_open();
          if (cVar6 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Cannot open file for writing: ",0x1e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            bVar21 = true;
            std::ostream::flush();
          }
          else {
            CreateHeader(local_350,(ostream *)local_230,local_2f0._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_230,"<table width=\"100%\" border=\"0\" height=\"1\">",0x2a)
            ;
            std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + (char)local_230);
            std::ostream::put((char)local_230);
            std::ostream::flush();
            local_298.
            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_298.
            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_298.
            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                      (&local_248,&local_348->m_ErrorList);
            pEVar19 = local_248.
                      super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (local_248.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_248.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              do {
                for (pplVar17 = (pointer *)pEVar19->line; pplVar17 <= (undefined1 *)pEVar19->line2;
                    pplVar17 = (pointer *)((long)pplVar17 + 1)) {
                  local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  bVar21 = local_298.
                           super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           local_298.
                           super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  local_338.first = (long)pplVar17;
                  if (bVar21) {
LAB_00145b9d:
                    local_2d0._M_dataplus._M_p = (pointer)pEVar19->number;
                    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                              (&local_338.second,(iterator)0x0,(long *)&local_2d0);
                    std::
                    vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                    ::push_back(&local_298,&local_338);
                  }
                  else {
                    lVar10 = (local_298.
                              super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first;
                    ppVar15 = local_298.
                              super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    while (lVar10 != (int)pplVar17) {
                      ppVar15 = ppVar15 + 1;
                      bVar21 = ppVar15 ==
                               local_298.
                               super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      if (bVar21) goto LAB_00145b9d;
                      lVar10 = ppVar15->first;
                    }
                    if (bVar21) goto LAB_00145b9d;
                    local_2d0._M_dataplus._M_p = (pointer)pEVar19->number;
                    __position._M_current =
                         (ppVar15->second).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (ppVar15->second).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                                (&ppVar15->second,__position,(long *)&local_2d0);
                    }
                    else {
                      *__position._M_current = (long)local_2d0._M_dataplus._M_p;
                      (ppVar15->second).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish = __position._M_current + 1;
                    }
                  }
                  if (local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_338.second.super__Vector_base<long,_std::allocator<long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                pEVar19 = pEVar19 + 1;
              } while (pEVar19 !=
                       local_248.
                       super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            }
            uVar12 = Parser::GetNumberOfLines(local_348);
            if (uVar12 != 0) {
              i = 0;
              local_33c = 0;
              uVar18 = 0;
              local_250 = uVar12;
              do {
                local_338.first =
                     (long)&local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl
                            .super__Vector_impl_data._M_finish;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
                uVar12 = 0xffffffffffffffff;
                if (local_298.
                    super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_298.
                    super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  ppVar15 = local_298.
                            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
LAB_00145ca4:
                  if (ppVar15->first != (long)(int)(uVar18 + 1)) goto code_r0x00145cae;
                  for (puVar20 = (unsigned_long *)
                                 (ppVar15->second).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                      puVar20 !=
                      (unsigned_long *)
                      (ppVar15->second).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish; puVar20 = puVar20 + 1) {
                    uVar12 = *puVar20;
                    if (local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start == (pointer)0x0) {
                      Parser::GetErrorTag_abi_cxx11_(&local_2d0,local_348,uVar12);
                      std::__cxx11::string::_M_append
                                ((char *)&local_338,(ulong)local_2d0._M_dataplus._M_p);
                    }
                    else {
                      std::__cxx11::string::append((char *)&local_338);
                      Parser::GetErrorTag_abi_cxx11_(&local_2d0,local_348,uVar12);
                      std::__cxx11::string::_M_append
                                ((char *)&local_338,(ulong)local_2d0._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p);
                    }
                  }
                }
LAB_00145cb7:
                if ((long)uVar12 < 0) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"<tr>",4);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,"<tr bgcolor=\"",0xd);
                  sVar9 = strlen(ErrorColor + uVar12 * 8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,ErrorColor + uVar12 * 8,sVar9);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\">",2);
                }
                cVar6 = (char)(ostream *)local_230;
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + cVar6);
                std::ostream::put(cVar6);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"<td height=\"1\">",0xf);
                uVar18 = uVar18 + 1;
                poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"</td>",5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"<td height=\"1\">",0xf);
                lVar10 = local_338.first;
                if ((pointer *)local_338.first == (pointer *)0x0) {
                  std::ios::clear((int)auStack_358 + (int)*(undefined8 *)(local_230._0_8_ + -0x18) +
                                  0x128);
                }
                else {
                  sVar9 = strlen((char *)local_338.first);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,(char *)lVar10,sVar9);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"</td>",5);
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + cVar6);
                std::ostream::put(cVar6);
                std::ostream::flush();
                Parser::GetLine_abi_cxx11_(&local_2d0,local_348,i);
                lVar10 = std::__cxx11::string::find((char *)&local_338,0x17763c,0);
                if (lVar10 != -1) {
                  uVar7 = 0;
                  do {
                    if (local_2d0._M_dataplus._M_p[uVar7] != '\n') {
                      if (local_2d0._M_dataplus._M_p[uVar7] != ' ') break;
                      local_2d0._M_dataplus._M_p[uVar7] = '*';
                    }
                    uVar7 = uVar7 + 1;
                  } while( true );
                }
                lVar10 = std::__cxx11::string::find((char *)&local_338,0x177640,0);
                if ((lVar10 != -1) && (1 < (int)(uint)local_2d0._M_string_length)) {
                  lVar10 = (ulong)((uint)local_2d0._M_string_length & 0x7fffffff) + 1;
                  do {
                    if (local_2d0._M_dataplus._M_p[lVar10 + -2] != ' ') break;
                    local_2d0._M_dataplus._M_p[lVar10 + -2] = '*';
                    lVar10 = lVar10 + -1;
                  } while (2 < lVar10);
                }
                cVar16 = (char)&local_2d0;
                uVar14 = std::__cxx11::string::find(cVar16,10);
                if (uVar14 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2d0,uVar14,(char *)0x1,0x16b513);
                }
                while (uVar14 = std::__cxx11::string::find((char *)&local_2d0,0x178498,0),
                      uVar14 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2d0,uVar14,(char *)0x1,0x177644);
                }
                while (uVar14 = std::__cxx11::string::find((char *)&local_2d0,0x1779c2,0),
                      uVar14 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2d0,uVar14,(char *)0x1,0x177649);
                }
                uVar14 = std::__cxx11::string::find(cVar16,0x20);
                while (uVar14 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2d0,uVar14,(char *)0x1,0x17764e);
                  uVar14 = std::__cxx11::string::find(cVar16,0x20);
                }
                if ((local_33c & 1) != 0) {
                  std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,0x177655);
                }
                uVar14 = std::__cxx11::string::find((char *)&local_2d0,0x16b53a,0);
                if (uVar14 == 0xffffffffffffffff) {
                  uVar14 = std::__cxx11::string::find((char *)&local_2d0,0x16b53d,0);
                  if (uVar14 != 0xffffffffffffffff) {
                    do {
                      std::__cxx11::string::replace((ulong)&local_2d0,uVar14,(char *)0x0,0x177655);
                      uVar14 = std::__cxx11::string::find((char *)&local_2d0,0x16b53d,uVar14 + 0x17)
                      ;
                    } while (uVar14 != 0xffffffffffffffff);
                    local_33c = 0xffffff01;
                  }
                  if ((local_33c & 1) != 0) {
                    std::__cxx11::string::replace
                              ((ulong)&local_2d0,local_2d0._M_string_length,(char *)0x0,0x177673);
                  }
                  lVar10 = std::__cxx11::string::find((char *)&local_2d0,0x16b540,0);
                  if (lVar10 != -1) {
                    do {
                      std::__cxx11::string::replace
                                ((ulong)&local_2d0,lVar10 + 2,(char *)0x0,0x177673);
                      lVar10 = std::__cxx11::string::find((char *)&local_2d0,0x16b540,lVar10 + 8);
                    } while (lVar10 != -1);
                    local_33c = 0;
                  }
                }
                else {
                  std::__cxx11::string::replace((ulong)&local_2d0,uVar14,(char *)0x0,0x177655);
                  std::__cxx11::string::append((char *)&local_2d0);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,
                           "<td height=\"1\"><font face=\"Courier New, Courier, mono\" size=\"2\">",
                           0x40);
                _Var4._M_p = local_2d0._M_dataplus._M_p;
                if (local_2d0._M_dataplus._M_p == (char *)0x0) {
                  std::ios::clear((int)auStack_358 + (int)*(undefined8 *)(local_230._0_8_ + -0x18) +
                                  0x128);
                }
                else {
                  sVar9 = strlen(local_2d0._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,_Var4._M_p,sVar9);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"</font></td>",0xc);
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + cVar6);
                std::ostream::put(cVar6);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"</tr>",5);
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + cVar6);
                std::ostream::put(cVar6);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                  operator_delete(local_2d0._M_dataplus._M_p);
                }
                if ((pointer *)local_338.first !=
                    &local_338.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
                  operator_delete((void *)local_338.first);
                }
                i = (unsigned_long)uVar18;
              } while (i < local_250);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"</table>",8);
            cVar6 = (char)(ostream *)local_230;
            std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + cVar6);
            std::ostream::put(cVar6);
            std::ostream::flush();
            CreateFooter(local_350,(ostream *)local_230);
            std::ofstream::close();
            local_348 = local_348 + 1;
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector(&local_248);
            std::
            vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ::~vector(&local_298);
            bVar21 = false;
            uVar14 = (ulong)local_29c;
            dir = local_2b0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
        }
        local_230._0_8_ = local_278;
        *(undefined8 *)(local_230 + *(long *)(local_278 + -0x18)) = local_280;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
        if (bVar21) goto LAB_001464df;
      }
      local_351 = local_348 ==
                  (local_350->m_Parsers->
                  super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
    } while (!local_351);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
LAB_001464df:
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  kwssys::Directory::~Directory(&local_2a8);
  return (bool)(local_351 & 1);
code_r0x00145cae:
  ppVar15 = ppVar15 + 1;
  if (ppVar15 ==
      local_298.
      super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00145cb7;
  goto LAB_00145ca4;
}

Assistant:

bool Generator::GenerateHTML(const char* dir,bool showAllErrors)
{
  // Check if the directory exists. If not create it
  kwssys::Directory directory;
  if(!directory.Load(dir))
    {
    std::cout << "Creating HTML directory: " << dir << std::endl;
    if(!kwssys::SystemTools::MakeDirectory(dir))
      {
      std::cout << "Cannot create HTML directory: " << dir << std::endl;
      }
    }

  std::string imagedir = dir;
  imagedir += "/images";

  // Copy the m_ProjectLogo and m_KWStyleLogo to the images directory
  if (!m_ProjectLogo.empty() || !m_KWStyleLogo.empty()) {
    if(!kwssys::SystemTools::MakeDirectory(imagedir.c_str()))
      {
      std::cout << "Cannot create images directory: "
                << imagedir.c_str() << std::endl;
      }
  }

  if (!m_ProjectLogo.empty()) {
    std::string imageProjectLogo = imagedir;
    imageProjectLogo += "/";
    imageProjectLogo += kwssys::SystemTools::GetFilenameName(m_ProjectLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_ProjectLogo.c_str(),imageProjectLogo.c_str()))
      {
      std::cout << "Cannot copy the project logo file: "
                << m_ProjectLogo.c_str() << " into "
                << imageProjectLogo.c_str() << std::endl;
      }
  }

  if (!m_KWStyleLogo.empty()) {
    std::string imageKWStyleLogo = imagedir;
    imageKWStyleLogo += "/";
    imageKWStyleLogo += kwssys::SystemTools::GetFilenameName(m_KWStyleLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_KWStyleLogo.c_str(),imageKWStyleLogo.c_str()))
      {
      std::cout << "Cannot copy the KWStyle logo file: "
                << m_KWStyleLogo.c_str() << " into "
                << imageKWStyleLogo.c_str() << std::endl;
      }
  }

  // Generate the matrix representation
  this->GenerateMatrix(dir,showAllErrors);
  this->GenerateDescription(dir);

  std::cout << "Generating HTML...";

  // For each file we generate an html page
  ParserVectorType::const_iterator it = m_Parsers->begin();
  while(it != m_Parsers->end())
    {
    if (!showAllErrors && (*it).GetErrors().empty()) {
      it++;
      continue;
    }

    std::ofstream file;

    if ((*it).GetFilename().empty()) {
      it++;
      continue;
    }

    // Extract the filename
    // Replace '/' by '_'
    std::string filename = dir;
    filename += "/";
    std::string filename2 = (*it).GetFilename();
    if(long int pos = filename2.find(":/") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }
    if(long int pos = filename2.find(":\\") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }

      auto slash = static_cast<long int>(filename2.find_last_of("/"));
      unsigned int i = 0;
      while (slash != -1 && i < m_MaxDirectoryDepth) {
        filename2.replace(slash, 1, "_");
        slash = static_cast<long int>(filename2.find_last_of("/"));
        i++;
      }
    slash = static_cast<long int>(filename2.find_last_of("/"));
    if(slash != -1)
      {
      filename2 = filename2.substr(slash+1,filename2.size()-slash-1);
      }
    filename += filename2;

    filename += ".html";

    file.open(filename.c_str(), std::ios::binary | std::ios::out);
    if(!file.is_open())
      {
      std::cout << "Cannot open file for writing: " <<  std::endl;
      return false;
      }

    this->CreateHeader(&file,filename.c_str());

    file << R"(<table width="100%" border="0" height="1">)" << std::endl;

    // To speedup the process we list the lines that have errors
    using ErrorLineType = std::pair<long, std::vector<long>>;
    std::vector<ErrorLineType> errorLines;

    const Parser::ErrorVectorType errors = (*it).GetErrors();
    auto itError = errors.begin();
    while (itError != errors.end()) {
      for (unsigned long index = (*itError).line; index <= (*itError).line2;
           index++) {
        ErrorLineType errLine;
        errLine.first = index;

        // Check if the line already exists
        auto errorLineIt = errorLines.begin();
        while (errorLineIt != errorLines.end()) {
          if ((*errorLineIt).first == static_cast<int>(index)) {
            break;
          }
          errorLineIt++;
        }

        if (errorLineIt != errorLines.end()) {
          (*errorLineIt).second.push_back((*itError).number);
        } else {
          errLine.second.push_back((*itError).number);
          errorLines.push_back(errLine);
        }
      }
      itError++;
     }

    bool comment = false;
    unsigned long nLines = (*it).GetNumberOfLines();
    for(i=0;i<nLines;i++)
      {
      // Look in the errors if there is a match for this line
      long error = -1;
      std::string errorTag = "";

      std::vector<ErrorLineType>::const_iterator errorLineIt = errorLines.begin();
      while(errorLineIt != errorLines.end())
        {
        if((*errorLineIt).first == static_cast<int>(i+1))
          {
          auto err = (*errorLineIt).second.begin();
          while(err != (*errorLineIt).second.end())
            {
            error = *err;
            if (errorTag.empty()) {
              errorTag += (*it).GetErrorTag(error);
            } else {
              errorTag += ",";
              errorTag += (*it).GetErrorTag(error);
            }
             err++;
             }
           break;
           }
         errorLineIt++;
         }

      if(error>=0)
        {
        file << "<tr bgcolor=\"" << ErrorColor[error]  << "\">" << std::endl;
        }
      else
        {
        file << "<tr>" << std::endl;
        }

      // First column is the line number
      file << "<td height=\"1\">" << i+1 << "</td>" << std::endl;

      // Second column is the error tag
      file << "<td height=\"1\">" << errorTag.c_str() << "</td>" << std::endl;

      std::string l = (*it).GetLine(i);

      // If the error is of type INDENT we show the problem as *
      if(errorTag.find("IND") != std::string::npos)
        {
        unsigned int k = 0;
        while((l[k] == ' ') || (l[k] == '\n'))
          {
          if(l[k] == ' ')
            {
            l[k]='*';
            }
          k++;
          }
        }

      // If the error is of type extra spaces we show the problem as *
      if(errorTag.find("ESP") != std::string::npos)
        {
        int k = static_cast<int>(l.size())-1;
        while(k>0 && (l[k] == ' '))
          {
          l[k]='*';
          k--;
          }
        }

      // Remove the first \n
        auto p = static_cast<long int>(l.find('\n'));
        if (p != -1) {
          l.replace(p, 1, "");
        }

      // Replace < and >
        auto inf = static_cast<long int>(l.find("<", 0));
        while (inf != -1) {
          l.replace(inf, 1, "&lt;");
          inf = static_cast<long int>(l.find("<", 0));
        }

        auto sup = static_cast<long int>(l.find(">", 0));
        while (sup != -1) {
          l.replace(sup, 1, "&gt;");
          sup = static_cast<long int>(l.find(">", 0));
        }

      // Replace the space by &nbsp;
        auto space = static_cast<long int>(l.find(' ', 0));
        while (space != -1) {
          l.replace(space, 1, "&nbsp;");
          space = static_cast<long int>(l.find(' ', space + 1));
        }

      // Show the comments in green
      if(comment)
        {
        l.insert(0,"<font color=\"#009933\">");
        }

      // Show the comments in green
      space = static_cast<long int>(l.find("//",0));
      if(space != -1)
        {
        l.insert(space,"<font color=\"#009933\">");
        l += "<font>";
        }
      else
        {
        space = static_cast<long int>(l.find("/*",0));
        while(space != -1)
          {
          comment = true;
          l.insert(space,"<font color=\"#009933\">");
          space = static_cast<long int>(l.find("/*",space+23));
          }

        if(comment)
          {
          l.insert(l.size(),"</font>");
          }

        space = static_cast<long int>(l.find("*/",0));

        while(space != -1)
          {
          comment = false;
          l.insert(space+2,"</font>");
          space = static_cast<long int>(l.find("*/",space+8));
          }
        }
        file
            << R"(<td height="1"><font face="Courier New, Courier, mono" size="2">)"
            << l.c_str() << "</font></td>" << std::endl;
        file << "</tr>" << std::endl;
      }

    file << "</table>" << std::endl;

    this->CreateFooter(&file);

    file.close();
    it++;
    }

  std::cout << "done" << std::endl;
  return true;
}